

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_5.cpp
# Opt level: O2

int main(void)

{
  ostream *poVar1;
  int iVar2;
  bool bVar3;
  Date d;
  
  Date::Date(&d,0x7e4,feb,0x1d);
  poVar1 = operator<<((ostream *)&std::cout,&d);
  std::endl<char,std::char_traits<char>>(poVar1);
  iVar2 = 5;
  while (bVar3 = iVar2 != 0, iVar2 = iVar2 + -1, bVar3) {
    Date::add_year(&d,1);
    poVar1 = operator<<((ostream *)&std::cout,&d);
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  return 0;
}

Assistant:

int main()
{
	try
	{
		Date d{ 2020, Month::feb, 29 };
		std::cout << d << std::endl;
		for (auto i = 1; i <= 5; ++i)
		{
			d.add_year(1);
			std::cout << d << std::endl;
		}
	}
	catch (const std::exception& e)
	{
		std::cerr << e.what() << std::endl;
	}

	return 0;
}